

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

connectdata * Curl_conncache_extract_oldest(Curl_easy *data)

{
  connectbundle *pcVar1;
  connectbundle *pcVar2;
  timediff_t tVar3;
  curltime cVar4;
  curltime newer;
  curltime older;
  connectdata *conn;
  connectbundle *local_78;
  connectbundle *bundle_candidate;
  connectbundle *bundle;
  connectdata *conn_candidate;
  curltime now;
  timediff_t score;
  timediff_t highscore;
  curl_hash_element *he;
  curl_llist_element *curr;
  curl_hash_iterator iter;
  conncache *connc;
  Curl_easy *data_local;
  
  iter.current_element = (curl_llist_element *)(data->state).conn_cache;
  score = -1;
  bundle = (connectbundle *)0x0;
  local_78 = (connectbundle *)0x0;
  cVar4 = Curl_now();
  if (data->share != (Curl_share *)0x0) {
    Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
  }
  Curl_hash_start_iterate((curl_hash *)iter.current_element,(curl_hash_iterator *)&curr);
  highscore = (timediff_t)Curl_hash_next_element((curl_hash_iterator *)&curr);
  while (highscore != 0) {
    pcVar1 = *(connectbundle **)(highscore + 0x18);
    for (he = (curl_hash_element *)(pcVar1->conn_list).head; he != (curl_hash_element *)0x0;
        he = (curl_hash_element *)(he->list).next) {
      pcVar2 = (connectbundle *)(he->list).ptr;
      if (((pcVar2[2].multiuse & 1) == 0) &&
         (newer._12_4_ = 0, newer.tv_sec = SUB128(cVar4._0_12_,0),
         newer.tv_usec = SUB124(cVar4._0_12_,8), older._12_4_ = 0,
         older._0_12_ = *(undefined1 (*) [12])&pcVar2[0xb].conn_list.size,
         tVar3 = Curl_timediff(newer,older), score < tVar3)) {
        local_78 = pcVar1;
        bundle = pcVar2;
        score = tVar3;
      }
    }
    highscore = (timediff_t)Curl_hash_next_element((curl_hash_iterator *)&curr);
  }
  if (bundle != (connectbundle *)0x0) {
    bundle_remove_conn(local_78,(connectdata *)bundle);
    iter.current_element[2].ptr = (void *)((long)iter.current_element[2].ptr + -1);
  }
  if (data->share != (Curl_share *)0x0) {
    Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
  }
  return (connectdata *)bundle;
}

Assistant:

struct connectdata *
Curl_conncache_extract_oldest(struct Curl_easy *data)
{
  struct conncache *connc = data->state.conn_cache;
  struct curl_hash_iterator iter;
  struct curl_llist_element *curr;
  struct curl_hash_element *he;
  timediff_t highscore =- 1;
  timediff_t score;
  struct curltime now;
  struct connectdata *conn_candidate = NULL;
  struct connectbundle *bundle;
  struct connectbundle *bundle_candidate = NULL;

  now = Curl_now();

  CONN_LOCK(data);
  Curl_hash_start_iterate(&connc->hash, &iter);

  he = Curl_hash_next_element(&iter);
  while(he) {
    struct connectdata *conn;

    bundle = he->ptr;

    curr = bundle->conn_list.head;
    while(curr) {
      conn = curr->ptr;

      if(!conn->inuse) {
        /* Set higher score for the age passed since the connection was used */
        score = Curl_timediff(now, conn->now);

        if(score > highscore) {
          highscore = score;
          conn_candidate = conn;
          bundle_candidate = bundle;
        }
      }
      curr = curr->next;
    }

    he = Curl_hash_next_element(&iter);
  }
  if(conn_candidate) {
    /* remove it to prevent another thread from nicking it */
    bundle_remove_conn(bundle_candidate, conn_candidate);
    connc->num_conn--;
    DEBUGF(infof(data, "The cache now contains %"
                 CURL_FORMAT_CURL_OFF_TU " members\n",
                 (curl_off_t) connc->num_conn));
  }
  CONN_UNLOCK(data);

  return conn_candidate;
}